

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchQbf.cpp
# Opt level: O3

void Bmatch_Construct_MUXes
               (vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *Pi_Pool,Abc_Obj_t **pObj2,
               Abc_Ntk_t **pNtk_Qbf,int *level,int *fForPi)

{
  char cVar1;
  int iVar2;
  pointer ppAVar3;
  Abc_Aig_t *pMan;
  uint *puVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  ushort *puVar7;
  long lVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t_ *p0;
  pointer ppAVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> new_Pi_Pool;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> local_68;
  uint *local_48;
  char *local_40;
  Abc_Obj_t *local_38;
  
  local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Abc_Obj_t_ **)0x0;
  local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Abc_Obj_t_ **)0x0;
  ppAVar10 = (Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppAVar3 = (Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppAVar3 == ppAVar10) {
    __assert_fail("Pi_Pool.size() >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchQbf.cpp"
                  ,0x123,
                  "void Bmatch_Construct_MUXes(vector<Abc_Obj_t *> &, Abc_Obj_t *&, Abc_Ntk_t *&, int &, int &)"
                 );
  }
  if ((ulong)((long)ppAVar3 - (long)ppAVar10) < 9) {
    if (*fForPi == 1) {
      pAVar5 = Abc_NtkCreateObj(*pNtk_Qbf,ABC_OBJ_PI);
      iVar2 = *fForPi;
      pcVar6 = Abc_ObjName(*pObj2);
      puVar7 = (ushort *)operator_new__(0x1e);
      lVar8 = 2;
      do {
        cVar1 = pcVar6[lVar8 + -2];
        *(char *)((long)puVar7 + lVar8) = cVar1;
        lVar8 = lVar8 + 1;
      } while (cVar1 != '\0');
      *puVar7 = iVar2 == 1 ^ 0x5f79;
      Abc_ObjAssignName(pAVar5,(char *)puVar7,"_*");
      operator_delete(puVar7,1);
      pMan = (Abc_Aig_t *)(*pNtk_Qbf)->pManFunc;
      pAVar9 = Abc_AigConst1(*pNtk_Qbf);
      p0 = Abc_AigMux(pMan,pAVar5,(Abc_Obj_t *)((ulong)pAVar9 ^ 1),
                      *(Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
    }
    else {
      p0 = *ppAVar10;
    }
    pAVar5 = Abc_NtkCreateObj(*pNtk_Qbf,ABC_OBJ_PI);
    iVar2 = *fForPi;
    pcVar6 = Abc_ObjName(*pObj2);
    puVar7 = (ushort *)operator_new__(0x1e);
    lVar8 = 2;
    do {
      cVar1 = pcVar6[lVar8 + -2];
      *(char *)((long)puVar7 + lVar8) = cVar1;
      lVar8 = lVar8 + 1;
    } while (cVar1 != '\0');
    *puVar7 = iVar2 == 1 ^ 0x5f79;
    Abc_ObjAssignName(pAVar5,(char *)puVar7,"_0");
    operator_delete(puVar7,1);
    pAVar5 = Abc_AigMux((Abc_Aig_t *)(*pNtk_Qbf)->pManFunc,pAVar5,(Abc_Obj_t *)((ulong)p0 ^ 1),p0);
    ((*pObj2)->field_6).pCopy = pAVar5;
    return;
  }
  local_48 = (uint *)level;
  local_40 = (char *)operator_new__(10);
  puVar4 = local_48;
  sprintf(local_40,"_%d",(ulong)*local_48);
  *puVar4 = *puVar4 + 1;
  pAVar5 = Abc_NtkCreateObj(*pNtk_Qbf,ABC_OBJ_PI);
  iVar2 = *fForPi;
  pcVar6 = Abc_ObjName(*pObj2);
  puVar7 = (ushort *)operator_new__(0x1e);
  lVar8 = 2;
  do {
    cVar1 = pcVar6[lVar8 + -2];
    *(char *)((long)puVar7 + lVar8) = cVar1;
    lVar8 = lVar8 + 1;
  } while (cVar1 != '\0');
  *puVar7 = iVar2 == 1 ^ 0x5f79;
  Abc_ObjAssignName(pAVar5,(char *)puVar7,local_40);
  operator_delete(puVar7,1);
  ppAVar10 = (Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((long)(Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppAVar10 == 8) {
    uVar11 = 0;
  }
  else {
    uVar13 = 0;
    do {
      local_38 = Abc_AigMux((Abc_Aig_t *)(*pNtk_Qbf)->pManFunc,pAVar5,ppAVar10[uVar13 + 1],
                            ppAVar10[uVar13]);
      if (local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::_M_realloc_insert<Abc_Obj_t_*const&>
                  ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_38;
        local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar13 = uVar13 + 2;
      ppAVar10 = (Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      uVar12 = (long)(Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar10;
      uVar11 = ((long)uVar12 >> 3) - 1;
    } while (uVar13 < uVar11);
    if ((uVar12 & 8) == 0) goto LAB_007b8f3e;
  }
  if (local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::_M_realloc_insert<Abc_Obj_t_*const&>
              ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&local_68,
               (iterator)
               local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
               super__Vector_impl_data._M_finish,ppAVar10 + uVar11);
  }
  else {
    *local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
     super__Vector_impl_data._M_finish = ppAVar10[uVar11];
    local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
LAB_007b8f3e:
  Bmatch_Construct_MUXes(&local_68,pObj2,pNtk_Qbf,(int *)local_48,fForPi);
  if (local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Bmatch_Construct_MUXes( vector< Abc_Obj_t * > & Pi_Pool, Abc_Obj_t *& pObj2, Abc_Ntk_t *& pNtk_Qbf, int & level, int & fForPi)
{
    vector< Abc_Obj_t * > new_Pi_Pool;
    Abc_Obj_t * pObj, * pObjA;
    char * pSuffix, * pName;

    assert( Pi_Pool.size() >= 1);
    if( Pi_Pool.size() >= 2){
        pSuffix = new char[10];
        sprintf( pSuffix, "_%d", level);
        ++level;

        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        if( fForPi == 1 ){
        pName = "x_";
        }
        else{
            pName = "y_";
        }
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(pObj2));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        for( int i = 0; i < Pi_Pool.size() - 1; i = i + 2 ){
            pObj = Abc_AigMux( (Abc_Aig_t * )pNtk_Qbf->pManFunc, pObjA, Pi_Pool[i + 1], Pi_Pool[i] );
            new_Pi_Pool.push_back( pObj );
        }
        if( !(Pi_Pool.size() % 2 == 0) ){
            new_Pi_Pool.push_back( Pi_Pool[ Pi_Pool.size() - 1 ] );
        }
        Bmatch_Construct_MUXes( new_Pi_Pool, pObj2, pNtk_Qbf, level, fForPi );
    }
    else{
        pObj = Pi_Pool[0];
        if( fForPi == 1 ){
            pSuffix = "_*\0";
            pObjA = Abc_NtkCreatePi( pNtk_Qbf );

            if( fForPi == 1 ){
                pName = "x_";
            }
            else{
                pName = "y_";
            }
            pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(pObj2));
            Abc_ObjAssignName( pObjA, pName, pSuffix );
            delete pName;
            
            pObj = Abc_AigMux( (Abc_Aig_t * )pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot(Abc_AigConst1(pNtk_Qbf)), Pi_Pool[0] );
        }
        pSuffix = "_0\0";
        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        if( fForPi == 1 ){
            pName = "x_";
        }
        else{
            pName = "y_";
        }
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(pObj2));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        pObj = Abc_AigMux( (Abc_Aig_t * )pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot( pObj ), pObj );
        pObj2->pCopy = pObj;
    }
}